

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O2

TypeCast * __thiscall
soul::PoolAllocator::
allocate<soul::AST::TypeCast,soul::AST::Context&,soul::Type,soul::AST::CommaSeparatedList&>
          (PoolAllocator *this,Context *args,Type *args_1,CommaSeparatedList *args_2)

{
  PoolItem *pPVar1;
  Type local_48;
  
  pPVar1 = allocateSpaceForObject(this,0x50);
  local_48.category = args_1->category;
  local_48.arrayElementCategory = args_1->arrayElementCategory;
  local_48.isRef = args_1->isRef;
  local_48.isConstant = args_1->isConstant;
  local_48.primitiveType.type = (args_1->primitiveType).type;
  local_48.boundingSize = args_1->boundingSize;
  local_48.arrayElementBoundingSize = args_1->arrayElementBoundingSize;
  local_48.structure.object = (args_1->structure).object;
  (args_1->structure).object = (Structure *)0x0;
  AST::TypeCast::TypeCast((TypeCast *)&pPVar1->item,args,&local_48,&args_2->super_Expression);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_48.structure);
  pPVar1->destructor =
       allocate<soul::AST::TypeCast,_soul::AST::Context_&,_soul::Type,_soul::AST::CommaSeparatedList_&>
       ::anon_class_1_0_00000001::__invoke;
  return (TypeCast *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }